

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O0

void deqp::gles3::Accuracy::renderFaces
               (Functions *gl,SurfaceAccess *dstRef,TextureCube *refTexture,ReferenceParams *params,
               TextureRenderer *renderer,int x,int y,int width,int height,Vec2 *bottomLeft,
               Vec2 *topRight,Vec2 *texCoordTopRightFactor)

{
  GLenum err;
  reference pvVar1;
  float fVar2;
  bool local_ee;
  int local_ec;
  int local_e8;
  bool local_d9;
  TextureCubeView local_d8;
  SurfaceAccess local_a0;
  int local_7c;
  int local_78;
  int texCoordTRow;
  int texCoordSRow;
  int local_68;
  int local_64;
  int curH;
  int curW;
  int curY;
  int curX;
  undefined1 local_50 [2];
  bool isTop;
  bool isRightmost;
  int face;
  vector<float,_std::allocator<float>_> texCoord;
  int x_local;
  TextureRenderer *renderer_local;
  ReferenceParams *params_local;
  TextureCube *refTexture_local;
  SurfaceAccess *dstRef_local;
  Functions *gl_local;
  
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = x;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_50);
  for (curX = 0; curX < 6; curX = curX + 1) {
    local_d9 = curX == 2 || curX == 5;
    curY._3_1_ = local_d9;
    curY._2_1_ = 2 < curX;
    curW = (curX % 3) * (width / 3);
    curH = (curX / 3) * (height / 2);
    if (curX == 2 || curX == 5) {
      local_e8 = width - curW;
    }
    else {
      local_e8 = width / 3;
    }
    local_64 = local_e8;
    if ((bool)curY._2_1_) {
      local_ec = height - curH;
    }
    else {
      local_ec = height / 2;
    }
    local_68 = local_ec;
    glu::TextureTestUtil::computeQuadTexCoordCube
              ((vector<float,_std::allocator<float>_> *)local_50,curX,bottomLeft,topRight);
    local_78 = 0;
    if ((uint)curX < 2) {
      local_78 = 2;
    }
    local_ee = curX == 2 || curX == 3;
    local_7c = local_ee + 1;
    fVar2 = tcu::Vector<float,_2>::x(texCoordTopRightFactor);
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_50,(long)(local_78 + 6));
    *pvVar1 = *pvVar1 * fVar2;
    fVar2 = tcu::Vector<float,_2>::x(texCoordTopRightFactor);
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_50,(long)(local_78 + 9));
    *pvVar1 = *pvVar1 * fVar2;
    fVar2 = tcu::Vector<float,_2>::y(texCoordTopRightFactor);
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_50,(long)(local_7c + 3));
    *pvVar1 = *pvVar1 * fVar2;
    fVar2 = tcu::Vector<float,_2>::y(texCoordTopRightFactor);
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_50,(long)(local_7c + 9));
    *pvVar1 = *pvVar1 * fVar2;
    (*gl->viewport)(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_ + curW,y + curH,local_64,
                    local_68);
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_50,0);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (renderer,0,pvVar1,&params->super_RenderParams);
    tcu::SurfaceAccess::SurfaceAccess(&local_a0,dstRef,curW,curH,local_64,local_68);
    tcu::TextureCube::operator_cast_to_TextureCubeView(&local_d8,refTexture);
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_50,0);
    glu::TextureTestUtil::sampleTexture(&local_a0,&local_d8,pvVar1,params);
  }
  err = (*gl->getError)();
  glu::checkError(err,"Post render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aTextureFilteringTests.cpp"
                  ,0x20b);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_50);
  return;
}

Assistant:

static void renderFaces (
	const glw::Functions&		gl,
	const tcu::SurfaceAccess&	dstRef,
	const tcu::TextureCube&		refTexture,
	const ReferenceParams&		params,
	TextureRenderer&			renderer,
	int							x,
	int							y,
	int							width,
	int							height,
	const tcu::Vec2&			bottomLeft,
	const tcu::Vec2&			topRight,
	const tcu::Vec2&			texCoordTopRightFactor)
{
	DE_ASSERT(width == dstRef.getWidth() && height == dstRef.getHeight());

	vector<float> texCoord;

	DE_STATIC_ASSERT(tcu::CUBEFACE_LAST == 6);
	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		bool	isRightmost		= (face == 2) || (face == 5);
		bool	isTop			= face >= 3;
		int		curX			= (face % 3) * (width  / 3);
		int		curY			= (face / 3) * (height / 2);
		int		curW			= isRightmost	? (width-curX)	: (width	/ 3);
		int		curH			= isTop			? (height-curY)	: (height	/ 2);

		computeQuadTexCoordCube(texCoord, (tcu::CubeFace)face, bottomLeft, topRight);

		{
			// Move the top and right edges of the texture coord quad. This is useful when we want a cube edge visible.
			int texCoordSRow = face == tcu::CUBEFACE_NEGATIVE_X || face == tcu::CUBEFACE_POSITIVE_X ? 2 : 0;
			int texCoordTRow = face == tcu::CUBEFACE_NEGATIVE_Y || face == tcu::CUBEFACE_POSITIVE_Y ? 2 : 1;
			texCoord[6 + texCoordSRow] *= texCoordTopRightFactor.x();
			texCoord[9 + texCoordSRow] *= texCoordTopRightFactor.x();
			texCoord[3 + texCoordTRow] *= texCoordTopRightFactor.y();
			texCoord[9 + texCoordTRow] *= texCoordTopRightFactor.y();
		}

		gl.viewport(x+curX, y+curY, curW, curH);

		renderer.renderQuad(0, &texCoord[0], params);

		sampleTexture(tcu::SurfaceAccess(dstRef, curX, curY, curW, curH), refTexture, &texCoord[0], params);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Post render");
}